

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O0

void __thiscall
double_conversion::Bignum::AssignDecimalString(Bignum *this,Vector<const_char> value)

{
  Vector<const_char> buffer;
  Vector<const_char> buffer_00;
  int in_EDX;
  Bignum *in_RSI;
  Bignum *in_RDI;
  uint64_t digits;
  uint64_t digits_1;
  uint pos;
  int length;
  uint64_t in_stack_000001b8;
  Bignum *in_stack_000001c0;
  int exponent;
  Bignum *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  int local_1c;
  Vector<const_char> local_10;
  
  local_10.start_ = (char *)in_RSI;
  local_10.length_ = in_EDX;
  Zero(in_RDI);
  local_1c = Vector<const_char>::length(&local_10);
  while (exponent = (int)((ulong)in_RDI >> 0x20), 0x12 < local_1c) {
    buffer._8_8_ = in_stack_ffffffffffffffc0;
    buffer.start_ = in_stack_ffffffffffffffb8;
    ReadUInt64(buffer,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),(int)in_stack_ffffffffffffffb0
              );
    local_1c = local_1c + -0x13;
    MultiplyByPowerOfTen(in_stack_ffffffffffffffb0,(int)((ulong)in_RDI >> 0x20));
    AddUInt64(in_stack_000001c0,in_stack_000001b8);
  }
  buffer_00.start_._4_4_ = local_10._12_4_;
  buffer_00.start_._0_4_ = local_10.length_;
  buffer_00._8_8_ = in_stack_ffffffffffffffc0;
  ReadUInt64(buffer_00,(int)((ulong)local_10.start_ >> 0x20),(int)local_10.start_);
  MultiplyByPowerOfTen((Bignum *)local_10.start_,exponent);
  AddUInt64(in_stack_000001c0,in_stack_000001b8);
  Clamp((Bignum *)local_10.start_);
  return;
}

Assistant:

void Bignum::AssignDecimalString(const Vector<const char> value) {
  // 2^64 = 18446744073709551616 > 10^19
  static const int kMaxUint64DecimalDigits = 19;
  Zero();
  int length = value.length();
  unsigned pos = 0;
  // Let's just say that each digit needs 4 bits.
  while (length >= kMaxUint64DecimalDigits) {
    const uint64_t digits = ReadUInt64(value, pos, kMaxUint64DecimalDigits);
    pos += kMaxUint64DecimalDigits;
    length -= kMaxUint64DecimalDigits;
    MultiplyByPowerOfTen(kMaxUint64DecimalDigits);
    AddUInt64(digits);
  }
  const uint64_t digits = ReadUInt64(value, pos, length);
  MultiplyByPowerOfTen(length);
  AddUInt64(digits);
  Clamp();
}